

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O0

void __thiscall minibag::BZ2Stream::stopWrite(BZ2Stream *this)

{
  undefined8 uVar1;
  string *msg;
  Stream *in_RDI;
  uint nbytes_out;
  uint nbytes_in;
  string *in_stack_ffffffffffffff68;
  BagException *in_stack_ffffffffffffff70;
  BagIOException *this_00;
  uint *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  runtime_error in_stack_ffffffffffffff97;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  uint local_48;
  
  if (in_RDI[2]._vptr_Stream == (_func_int **)0x0) {
    uVar1 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    BagException::BagException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    __cxa_throw(uVar1,&BagException::typeinfo,BagException::~BagException);
  }
  BZ2_bzWriteClose((int *)CONCAT17(in_stack_ffffffffffffff97,
                                   CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),in_stack_ffffffffffffff78,
                   (uint *)in_stack_ffffffffffffff70);
  if (*(int *)&in_RDI[2].file_ == -6) {
    msg = (string *)__cxa_allocate_exception(0x10);
    this_00 = (BagIOException *)&stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    BagIOException::BagIOException(this_00,msg);
    __cxa_throw(msg,&BagIOException::typeinfo,BagIOException::~BagIOException);
  }
  Stream::advanceOffset(in_RDI,(ulong)local_48);
  Stream::setCompressedIn(in_RDI,0);
  return;
}

Assistant:

void BZ2Stream::stopWrite() {
    if (!bzfile_) {
        throw BagException("cannot close unopened bzfile");
    }

    unsigned int nbytes_in;
    unsigned int nbytes_out;
    BZ2_bzWriteClose(&bzerror_, bzfile_, 0, &nbytes_in, &nbytes_out);

    switch (bzerror_) {
        case BZ_IO_ERROR: throw BagIOException("BZ_IO_ERROR");
    }

    advanceOffset(nbytes_out);
    setCompressedIn(0);
}